

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O2

void __thiscall reference_no_default5::test_method(reference_no_default5 *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  equal_coll_impl local_1d1;
  assertion_result local_1d0;
  undefined4 local_1b4;
  vector<int,_std::allocator<int>_> v;
  undefined **local_198;
  ulong uStack_190;
  undefined8 *local_188;
  char *local_180;
  undefined8 local_170;
  vector<int,_std::allocator<int>_> x;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_198 = (undefined **)0x200000001;
  uStack_190 = 0x400000003;
  local_188._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_198;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_1d0);
  local_198 = (undefined **)0xc0000000b;
  uStack_190 = 0xe0000000d;
  local_188 = (undefined8 *)CONCAT44(local_188._4_4_,0xf);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_198;
  std::vector<int,_std::allocator<int>_>::vector(&x,__l_00,(allocator_type *)&local_1d0);
  local_1b4 = 0x2a;
  local_170 = 0x4029000000000000;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_148 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x112);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_48 = "";
  local_1d0._0_4_ = 0x2a;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_198,&local_50,0x112,1,2,&local_1b4,"a",&local_1d0,"42");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x115);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1d0,(equal_coll_impl *)&local_140,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_198,&local_80,0x115,1,0xd,4,"std::begin(b)","std::end(b)",
             "std::begin(v)","std::end(v)");
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_138 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x116);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[4],char[4]>
            (&local_198,&local_a0,0x116,1,2,"foo","c","foo","\"foo\"");
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x117);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_c8 = "";
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1d0._1_7_ = 0x40290000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_198,&local_d0,0x117,1,2,&local_170,"d",&local_1d0,"12.5");
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x11a);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1d0,&local_1d1,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_f8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_198,&local_100,0x11a,1,0xd,4,"std::begin(e)","std::end(e)",
             "std::begin(x)","std::end(x)");
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_198 = (undefined **)CONCAT44(local_198._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&v,(int *)&local_198);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x122);
  uStack_190 = uStack_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_00115a38;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_128 = "";
  local_1d0._0_8_ =
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_150 = (char *)CONCAT44(local_150._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_198,&local_130,0x122,1,2,&local_1d0,"v.size()",&local_150,"6");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&x.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(reference_no_default5)
{
    auto       v = std::vector<int>{ 1, 2, 3, 4, 5};
    auto const x = std::vector<int>{ 11, 12, 13, 14, 15};
    f_reference_no_default5(
            [&](auto&& a, auto&& b, auto&& c, auto&& d, auto&& e) {
            BOOST_CHECK_EQUAL(a, 42);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(b), std::end(b),
                    std::begin(v), std::end(v));
            BOOST_CHECK_EQUAL(c, "foo");
            BOOST_CHECK_EQUAL(d, 12.5);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(e), std::end(e),
                    std::begin(x), std::end(x));
            },
            "a"_na=42,
            "b"_na=v,
            "c"_na="foo",
            "d"_na=12.5,
            "e"_na=x
            );
    BOOST_CHECK_EQUAL(v.size(), 6); // check v was copied
}